

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::WFXMLScanner::scanCharData(WFXMLScanner *this,XMLBuffer *toUse)

{
  XMLReader *pXVar1;
  bool bVar2;
  bool bVar3;
  XMLCh XVar4;
  bool bVar5;
  int iVar6;
  XMLSize_t XVar7;
  XMLCh *pXVar8;
  ulong uVar9;
  XMLSize_t XVar10;
  Codes toEmit;
  XMLCh XVar11;
  int iVar12;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  char local_57;
  XMLCh local_56;
  bool local_53;
  XMLCh local_52;
  XMLBuffer *local_50;
  XMLCh local_48 [12];
  
  toUse->fIndex = 0;
  local_53 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  local_52 = L'\0';
  local_57 = '\0';
  local_50 = toUse;
  bVar5 = false;
  iVar12 = 0;
LAB_002b96b5:
  bVar2 = bVar5;
  if ((iVar12 == 0) && (!bVar2)) {
    pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    XVar7 = pXVar1->fCharsAvail - pXVar1->fCharIndex;
    if (XVar7 != 0) {
      XVar10 = 0;
      do {
        if ((pXVar1->fgCharCharsTable[(ushort)(pXVar1->fCharBuf + pXVar1->fCharIndex)[XVar10]] & 8)
            == 0) {
          XVar7 = XVar10;
          if (XVar10 == 0) goto LAB_002b9725;
          break;
        }
        XVar10 = XVar10 + 1;
      } while (XVar7 != XVar10);
      XMLBuffer::append(local_50,pXVar1->fCharBuf + pXVar1->fCharIndex,XVar7);
      pXVar1->fCharIndex = pXVar1->fCharIndex + XVar7;
      pXVar1->fCurCol = pXVar1->fCurCol + XVar7;
    }
  }
LAB_002b9725:
  pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  uVar9 = pXVar1->fCharIndex;
  if (pXVar1->fCharsAvail <= uVar9) {
    if ((pXVar1->fNoMore != false) || (bVar5 = XMLReader::refreshCharBuffer(pXVar1), !bVar5)) {
LAB_002b9800:
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,local_50);
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_53;
      return;
    }
    uVar9 = pXVar1->fCharIndex;
  }
  XVar11 = pXVar1->fCharBuf[uVar9];
  if (XVar11 != L'<') {
    pXVar1->fCharIndex = uVar9 + 1;
    local_56 = XVar11;
    if ((XVar11 & 0xdf50U) == 0) {
      XMLReader::handleEOL(pXVar1,&local_56,false);
    }
    else {
      pXVar1->fCurCol = pXVar1->fCurCol + 1;
    }
    local_57 = '\0';
    if (local_56 == L'&') goto code_r0x002b97aa;
    if ((local_56 & 0xfc00U) == 0xdc00) {
      toEmit = Unexpected2ndSurrogateChar;
      if (!bVar2) {
LAB_002b986b:
        XMLScanner::emitError(&this->super_XMLScanner,toEmit);
      }
LAB_002b98c2:
      bVar3 = false;
    }
    else {
      if ((local_56 & 0xfc00U) != 0xd800) {
        toEmit = Expected2ndSurrogateChar;
        if (bVar2) goto LAB_002b986b;
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
             [(uint)(ushort)local_56] & 0x40) == 0) {
          XMLString::binToText
                    ((uint)(ushort)local_56,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager)
          ;
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        goto LAB_002b98c2;
      }
      bVar3 = true;
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        bVar3 = bVar2;
      }
    }
    goto LAB_002b98c4;
  }
  goto LAB_002b9800;
code_r0x002b97aa:
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
            (this,local_50);
  bVar5 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
  iVar6 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                    (this,0,&local_56,&local_52,&local_57);
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar5;
  bVar5 = false;
  bVar3 = bVar2;
  if (iVar6 == 1) {
LAB_002b98c4:
    iVar6 = 0;
    XVar11 = local_56;
    if (local_57 == '\0') {
      if (local_56 == L'>') {
        XVar11 = L'>';
        if (iVar12 == 2) {
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
          XVar11 = local_56;
        }
      }
      else if (local_56 == L']') {
        XVar11 = L']';
        if (iVar12 == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = iVar12;
          if (iVar12 == 1) {
            iVar6 = 2;
          }
        }
      }
    }
    XVar7 = local_50->fIndex;
    if (XVar7 == local_50->fCapacity) {
      XMLBuffer::ensureCapacity(local_50,1);
      XVar7 = local_50->fIndex;
    }
    XVar4 = local_52;
    pXVar8 = local_50->fBuffer;
    XVar10 = XVar7 + 1;
    local_50->fIndex = XVar10;
    pXVar8[XVar7] = XVar11;
    bVar5 = bVar3;
    iVar12 = iVar6;
    if (local_52 != L'\0') {
      if (XVar10 == local_50->fCapacity) {
        XMLBuffer::ensureCapacity(local_50,1);
        XVar10 = local_50->fIndex;
        pXVar8 = local_50->fBuffer;
      }
      local_50->fIndex = XVar10 + 1;
      pXVar8[XVar10] = XVar4;
      local_52 = L'\0';
    }
  }
  goto LAB_002b96b5;
}

Assistant:

void WFXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                    {
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    }
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate) {
                            emitError(XMLErrs::Expected2ndSurrogateChar);
                        }
                        // Its got to at least be a valid XML character
                        else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}